

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdSetPsbtRedeemScript
              (void *handle,void *psbt_handle,int type,uint32_t index,char *redeem_script)

{
  undefined **ppuVar1;
  Psbt *this;
  bool bVar2;
  CfdException *pCVar3;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  Script script;
  int local_12c;
  undefined1 local_128 [16];
  char *local_118;
  Script local_110;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_d8;
  Script local_b8;
  TxOutReference local_80;
  
  local_12c = type;
  cfd::Initialize();
  ppuVar1 = (undefined **)(local_128 + 0x10);
  local_128._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_128);
  if ((undefined **)local_128._0_8_ != ppuVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(redeem_script);
  if (!bVar2) {
    if (*(long *)((long)psbt_handle + 0x18) == 0) {
      local_128._0_8_ = "cfdcapi_psbt.cpp";
      local_128._8_4_ = 0x88d;
      local_118 = "CfdSetPsbtRedeemScript";
      cfd::core::logger::log<>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"psbt is null.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_128._0_8_ = ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"Failed to handle statement. psbt is null.","");
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_128);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)local_128,redeem_script,(allocator *)&local_80);
    cfd::core::Script::Script(&local_b8,(string *)local_128);
    if ((undefined **)local_128._0_8_ != ppuVar1) {
      operator_delete((void *)local_128._0_8_);
    }
    local_d8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_12c == 2) {
      cfd::core::Psbt::GetTxInUtxo
                ((TxOut *)local_128,*(Psbt **)((long)psbt_handle + 0x18),index,false,(bool *)0x0);
      this = *(Psbt **)((long)psbt_handle + 0x18);
      cfd::core::TxOutReference::TxOutReference(&local_80,(TxOut *)local_128);
      cfd::core::Psbt::SetTxInUtxo(this,index,&local_80,&local_b8,&local_d8);
      local_80.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
           (_func_int **)&PTR__AbstractTxOutReference_007356f0;
      cfd::core::Script::~Script(&local_80.super_AbstractTxOutReference.locking_script_);
      local_128._0_8_ = &PTR__AbstractTxOut_007407d8;
      cfd::core::Script::~Script(&local_110);
    }
    else {
      if (local_12c != 3) {
        local_128._0_8_ = "cfdcapi_psbt.cpp";
        local_128._8_4_ = 0x89f;
        local_118 = "CfdSetPsbtRedeemScript";
        cfd::core::logger::log<int&>
                  ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"type is invalid: {}",
                   &local_12c);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_128._0_8_ = ppuVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,"Failed to parameter. type is invalid.","");
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_128);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::Psbt::SetTxOutData(*(Psbt **)((long)psbt_handle + 0x18),index,&local_b8,&local_d8);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_d8);
    cfd::core::Script::~Script(&local_b8);
    return 0;
  }
  local_128._0_8_ = "cfdcapi_psbt.cpp";
  local_128._8_4_ = 0x887;
  local_118 = "CfdSetPsbtRedeemScript";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"redeem_script is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_128._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"Failed to parameter. redeem_script is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_128);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetPsbtRedeemScript(
    void* handle, void* psbt_handle, int type, uint32_t index,
    const char* redeem_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeem_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeem_script is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script(redeem_script);
    std::vector<KeyData> key_list;
    switch (type) {
      case kCfdPsbtRecordTypeInput: {
        auto txout = psbt_obj->psbt->GetTxInUtxo(index);
        psbt_obj->psbt->SetTxInUtxo(
            index, TxOutReference(txout), script, key_list);
      } break;
      case kCfdPsbtRecordTypeOutput:
        psbt_obj->psbt->SetTxOutData(index, script, key_list);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}